

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O0

void parse_udp(packet_t *pkt)

{
  double in_XMM0_Qa;
  packet_t *pkt_local;
  
  if (pkt->payload < 8) {
    _log(in_XMM0_Qa);
  }
  pkt->udp = (udp_t *)(pkt->data + pkt->offset);
  pkt->offset = pkt->offset + 8;
  pkt->payload = pkt->payload + -8;
  return;
}

Assistant:

static int parse_udp(void *data, char **str, int inv)
{
	match_udp_t *m = (match_udp_t *)data;
	int inv_type = 0;

	char *p = *str;
	char *q = p;
	q = strtok(NULL, " \t\n");

	if (q == NULL) {
		log_err("opt \"%s\" arg is null", p);
		goto err;
	}

	if (strcmp(p, "--sport") == 0) {
		if (parse_port(q, m->src) != 0) {
			goto err;
		}

		inv_type = INV_UDP_SRC;
	} else if (strcmp(p, "--dport") == 0) {
		if (parse_port(q, m->dst) != 0) {
			goto err;
		}

		inv_type = INV_UDP_DST;
	}

	if (inv && inv_type) {
		m->invert |= inv_type;
	}

	p = q;
	return 0;
err:
	return -1;
}